

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMeshControl::BuildWrapMesh(TPZMHMeshControl *this,int dim)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TPZGeoEl *pTVar5;
  ostream *poVar6;
  void *this_00;
  TPZGeoMesh *pTVar7;
  int in_ESI;
  long *in_RDI;
  TPZGeoElSide gelside_2;
  int is_2;
  int ns_2;
  TPZGeoEl *gel_2;
  int64_t el_2;
  ofstream outvtk;
  ofstream out;
  int wrapmat_1;
  int neighmatid;
  TPZGeoElSide neighbour_1;
  TPZGeoElSide gelside_1;
  int is_1;
  int ns_1;
  TPZGeoEl *gel_1;
  int64_t el_1;
  int wrapmat;
  TPZGeoElSide neighbour;
  TPZGeoElSide gelside;
  int is;
  int ns;
  TPZGeoEl *gel;
  int64_t el;
  int64_t nel;
  TPZGeoElSide *in_stack_fffffffffffff978;
  TPZGeoMesh *in_stack_fffffffffffff980;
  undefined7 in_stack_fffffffffffff988;
  byte in_stack_fffffffffffff98f;
  TPZGeoElSide *in_stack_fffffffffffff990;
  TPZSavable in_stack_fffffffffffffa48;
  TPZGeoElSide *in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa84;
  TPZGeoElSide *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  long local_560;
  TPZGeoElSide *in_stack_fffffffffffffaa8;
  TPZMHMeshControl *in_stack_fffffffffffffab0;
  TPZGeoElSide *in_stack_fffffffffffffac0;
  TPZMHMeshControl *in_stack_fffffffffffffac8;
  undefined1 local_520 [512];
  undefined1 local_320 [184];
  size_t in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  TPZGeoElSide local_100;
  TPZGeoElSide local_e8;
  int local_d0;
  int local_cc;
  TPZGeoEl *local_c8;
  long local_c0;
  int local_70;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  int local_30;
  int local_2c;
  TPZGeoEl *local_28;
  long local_20;
  long local_18;
  int local_c;
  
  local_c = in_ESI;
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
  local_18 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1e163f7);
  for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
    TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
    local_28 = TPZGeoMesh::Element(in_stack_fffffffffffff980,(int64_t)in_stack_fffffffffffff978);
    if ((local_28 != (TPZGeoEl *)0x0) &&
       (iVar2 = (**(code **)(*(long *)local_28 + 0x210))(), iVar2 == local_c)) {
      local_2c = (**(code **)(*(long *)local_28 + 0xf0))();
      for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
        iVar2 = (**(code **)(*(long *)local_28 + 0x208))(local_28,local_30);
        if (iVar2 == local_c + -1) {
          TPZGeoElSide::TPZGeoElSide
                    (in_stack_fffffffffffff990,
                     (TPZGeoEl *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
                     (int)((ulong)in_stack_fffffffffffff980 >> 0x20));
          TPZGeoElSide::Neighbour
                    ((TPZGeoElSide *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988));
          while (iVar2 = TPZGeoElSide::operator!=(&local_60,&local_48), iVar2 != 0) {
            pTVar5 = TPZGeoElSide::Element(&local_60);
            iVar2 = TPZGeoEl::MaterialId(pTVar5);
            if (iVar2 == (int)in_RDI[0x18]) {
              TPZGeoElSide::TPZGeoElSide
                        ((TPZGeoElSide *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
              iVar2 = HasWrapNeighbour(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
              TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e165d1);
              local_70 = iVar2;
              if ((iVar2 == 0) || (iVar2 == (int)in_RDI[0x18])) {
                TPZGeoElSide::TPZGeoElSide
                          ((TPZGeoElSide *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
                CreateWrap((TPZMHMeshControl *)
                           CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                           in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
                TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e166bb);
              }
              else {
                pzinternal::DebugStopImpl(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
              }
            }
            TPZGeoElSide::Neighbour
                      ((TPZGeoElSide *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988)
                      );
            TPZGeoElSide::operator=
                      ((TPZGeoElSide *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e1671b);
          }
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e1672d);
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e1673a);
        }
      }
    }
  }
  for (local_c0 = 0; local_c0 < local_18; local_c0 = local_c0 + 1) {
    TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
    local_c8 = TPZGeoMesh::Element(in_stack_fffffffffffff980,(int64_t)in_stack_fffffffffffff978);
    if ((local_c8 != (TPZGeoEl *)0x0) &&
       (iVar2 = (**(code **)(*(long *)local_c8 + 0x210))(), iVar2 == local_c)) {
      local_cc = (**(code **)(*(long *)local_c8 + 0xf0))();
      for (local_d0 = 0; local_d0 < local_cc; local_d0 = local_d0 + 1) {
        iVar2 = (**(code **)(*(long *)local_c8 + 0x208))(local_c8,local_d0);
        if (iVar2 == local_c + -1) {
          TPZGeoElSide::TPZGeoElSide
                    (in_stack_fffffffffffff990,
                     (TPZGeoEl *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
                     (int)((ulong)in_stack_fffffffffffff980 >> 0x20));
          TPZGeoElSide::Neighbour
                    ((TPZGeoElSide *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988));
          while (iVar2 = TPZGeoElSide::operator!=(&local_100,&local_e8), iVar2 != 0) {
            pTVar5 = TPZGeoElSide::Element(&local_100);
            iVar2 = TPZGeoEl::MaterialId(pTVar5);
            bVar1 = (**(code **)(*in_RDI + 0x48))(in_RDI,iVar2);
            if ((bVar1 & 1) != 0) {
              TPZGeoElSide::TPZGeoElSide
                        ((TPZGeoElSide *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
              iVar3 = HasWrapNeighbour(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
              TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e1696b);
              if (((iVar3 == 0) || (iVar3 == *(int *)((long)in_RDI + 0xbc))) ||
                 (iVar3 == (int)in_RDI[0x18])) {
                if (iVar3 == 0) {
                  TPZGeoElSide::TPZGeoElSide
                            ((TPZGeoElSide *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
                  CreateWrap((TPZMHMeshControl *)
                             CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
                             in_stack_fffffffffffffa88,in_stack_fffffffffffffa84);
                  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e16c75);
                }
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cout,"neighbour is skeleton with matid ");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
                poVar6 = std::operator<<(poVar6," but the element has a wrap neighbour with matid ")
                ;
                this_00 = (void *)std::ostream::operator<<(poVar6,iVar3);
                std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
                TPZGeoElSide::Print(in_stack_fffffffffffffa50,
                                    (ostream *)in_stack_fffffffffffffa48._vptr_TPZSavable);
                std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
                pTVar5 = TPZGeoElSide::Element(&local_e8);
                (**(code **)(*(long *)pTVar5 + 0x1a0))(pTVar5,&std::cout);
                std::ofstream::ofstream(local_320,"gmesh.txt",_S_out);
                pTVar7 = TPZAutoPointer<TPZGeoMesh>::operator->
                                   ((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
                (*(pTVar7->super_TPZSavable)._vptr_TPZSavable[9])(pTVar7,local_320);
                std::ofstream::ofstream(local_520,"gmesh.vtk",_S_out);
                TPZAutoPointer<TPZGeoMesh>::TPZAutoPointer
                          ((TPZAutoPointer<TPZGeoMesh> *)in_stack_fffffffffffff980,
                           (TPZAutoPointer<TPZGeoMesh> *)in_stack_fffffffffffff978);
                TPZVTKGeoMesh::PrintGMeshVTK
                          ((TPZAutoPointer<TPZGeoMesh> *)in_stack_fffffffffffff980,
                           (ofstream *)in_stack_fffffffffffff978,false,false);
                TPZAutoPointer<TPZGeoMesh>::~TPZAutoPointer
                          ((TPZAutoPointer<TPZGeoMesh> *)in_stack_fffffffffffff980);
                pzinternal::DebugStopImpl(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
                std::ofstream::~ofstream(local_520);
                std::ofstream::~ofstream(local_320);
              }
            }
            TPZGeoElSide::Neighbour
                      ((TPZGeoElSide *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988)
                      );
            TPZGeoElSide::operator=
                      ((TPZGeoElSide *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e16cd7);
          }
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e16ce9);
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e16cf6);
        }
      }
    }
  }
  for (local_560 = 0; local_560 < local_18; local_560 = local_560 + 1) {
    TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
    pTVar5 = TPZGeoMesh::Element(in_stack_fffffffffffff980,(int64_t)in_stack_fffffffffffff978);
    if ((pTVar5 != (TPZGeoEl *)0x0) &&
       (iVar2 = (**(code **)(*(long *)pTVar5 + 0x210))(), iVar2 == local_c)) {
      iVar2 = (**(code **)(*(long *)pTVar5 + 0xf0))();
      for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
        iVar4 = (**(code **)(*(long *)pTVar5 + 0x208))(pTVar5,iVar3);
        if (iVar4 == local_c + -1) {
          TPZGeoElSide::TPZGeoElSide
                    ((TPZGeoElSide *)&stack0xfffffffffffffa78,
                     (TPZGeoEl *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
                     (int)((ulong)in_stack_fffffffffffff980 >> 0x20));
          TPZGeoElSide::TPZGeoElSide
                    ((TPZGeoElSide *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
          iVar4 = HasWrapNeighbour(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
          in_stack_fffffffffffff98f = iVar4 != 0 ^ 0xff;
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e16e8a);
          if ((in_stack_fffffffffffff98f & 1) != 0) {
            in_stack_fffffffffffff980 = (TPZGeoMesh *)&stack0xfffffffffffffa48;
            TPZGeoElSide::TPZGeoElSide
                      ((TPZGeoElSide *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
            CreateWrap(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e16ed2);
          }
          TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e16f27);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZMHMeshControl::BuildWrapMesh(int dim)
{
    // all the elements should be neighbour of a wrap element
    int64_t nel = fGMesh->NElements();
  
//    int meshdim = fGMesh->Dimension();
// first create the neighbours of boundary elements (works for dim = fGMesh->Dimension()-2)
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || gel->Dimension() != dim) {
            continue;
        }
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                if (neighbour.Element()->MaterialId() == fBoundaryWrapMatId) {
                    int wrapmat = HasWrapNeighbour(gelside);
                    if (wrapmat && wrapmat != fBoundaryWrapMatId) {
                        DebugStop();
                    }
                    else
                    {
                        CreateWrap(gelside,fBoundaryWrapMatId);
                    }
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }
    // create the wrap elements around the skeleton elements
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || gel->Dimension() != dim) {
            continue;
        }
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                int neighmatid = neighbour.Element()->MaterialId();
                if (IsSkeletonMatid(neighmatid)) {
                    int wrapmat = HasWrapNeighbour(gelside);
                    if (wrapmat && wrapmat != fSkeletonWrapMatId && wrapmat != fBoundaryWrapMatId) {
                        std::cout << "neighbour is skeleton with matid " << neighmatid <<
                        " but the element has a wrap neighbour with matid " << wrapmat << std::endl;
                        gelside.Print(std::cout);
                        std::cout << std::endl;
                        gelside.Element()->Print(std::cout);
                        std::ofstream out("gmesh.txt");
                        fGMesh->Print(out);
                        std::ofstream outvtk("gmesh.vtk");
                        TPZVTKGeoMesh::PrintGMeshVTK(fGMesh,outvtk);
                        DebugStop();
                    }
                    else if(!wrapmat)
                    {
                        CreateWrap(neighbour,fSkeletonWrapMatId);
                    }
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || gel->Dimension() != dim) {
            continue;
        }
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            if (!HasWrapNeighbour(gelside)) {
                CreateWrap(gelside);
            }
        }
    }
}